

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

void Fra_ClauMinimizeClause_rec(Cla_Man_t *p,Vec_Int_t *vBasis,Vec_Int_t *vExtra)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  
  while( true ) {
    while( true ) {
      uVar1 = vExtra->nSize;
      if (uVar1 == 1) {
        return;
      }
      if ((int)uVar1 < 2) {
        __assert_fail("Vec_IntSize(vVec) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                      ,0x134,"Vec_Int_t *Vec_IntSplitHalf(Vec_Int_t *)");
      }
      iVar2 = vBasis->nSize;
      uVar7 = (ulong)(uVar1 >> 1);
      p_00 = (Vec_Int_t *)malloc(0x10);
      uVar3 = (uVar1 >> 1) + 1;
      if (uVar1 < 0x1e) {
        uVar3 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = uVar3;
      piVar5 = (int *)malloc((ulong)uVar3 << 2);
      p_00->pArray = piVar5;
      do {
        Vec_IntPush(p_00,vExtra->pArray[uVar7]);
        uVar7 = uVar7 + 1;
        uVar1 = vExtra->nSize;
      } while ((int)uVar7 < (int)uVar1);
      if ((int)uVar1 < 0) goto LAB_005c58eb;
      vExtra->nSize = uVar1 >> 1;
      if (1 < uVar1) {
        lVar6 = 0;
        do {
          Vec_IntPush(vBasis,vExtra->pArray[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < vExtra->nSize);
      }
      iVar4 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
      if (iVar4 == 0) break;
      if (vBasis->nSize < iVar2) goto LAB_005c58eb;
      vBasis->nSize = iVar2;
    }
    if (vBasis->nSize < iVar2) goto LAB_005c58eb;
    vBasis->nSize = iVar2;
    if (0 < p_00->nSize) {
      lVar6 = 0;
      do {
        Vec_IntPush(vBasis,p_00->pArray[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < p_00->nSize);
    }
    iVar4 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
    if (iVar4 == 0) break;
    if (vBasis->nSize < iVar2) goto LAB_005c58eb;
    vBasis->nSize = iVar2;
    vExtra = p_00;
  }
  Fra_ClauMinimizeClause_rec(p,vBasis,vExtra);
  if (iVar2 <= vBasis->nSize) {
    vBasis->nSize = iVar2;
    if (0 < vExtra->nSize) {
      lVar6 = 0;
      do {
        Vec_IntPush(vBasis,vExtra->pArray[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < vExtra->nSize);
    }
    Fra_ClauMinimizeClause_rec(p,vBasis,p_00);
    if (iVar2 <= vBasis->nSize) {
      vBasis->nSize = iVar2;
      if (0 < p_00->nSize) {
        lVar6 = 0;
        do {
          Vec_IntPush(vExtra,p_00->pArray[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < p_00->nSize);
      }
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      return;
    }
  }
LAB_005c58eb:
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

void Fra_ClauMinimizeClause_rec( Cla_Man_t * p, Vec_Int_t * vBasis, Vec_Int_t * vExtra )
{
    Vec_Int_t * vExtra2;
    int nSizeOld;
    if ( Vec_IntSize(vExtra) == 1 )
        return;
    nSizeOld = Vec_IntSize( vBasis );
    vExtra2 = Vec_IntSplitHalf( vExtra );

    // try the first half
    Vec_IntAppend( vBasis, vExtra );
    if ( Fra_ClauCheckClause( p, vBasis, NULL ) )
    {
        Vec_IntShrink( vBasis, nSizeOld );
        Fra_ClauMinimizeClause_rec( p, vBasis, vExtra );
        return;
    }
    Vec_IntShrink( vBasis, nSizeOld );

    // try the second half
    Vec_IntAppend( vBasis, vExtra2 );
    if ( Fra_ClauCheckClause( p, vBasis, NULL ) )
    {
        Vec_IntShrink( vBasis, nSizeOld );
        Fra_ClauMinimizeClause_rec( p, vBasis, vExtra2 );
        return;
    }
//    Vec_IntShrink( vBasis, nSizeOld );

    // find the smallest with the second half added
    Fra_ClauMinimizeClause_rec( p, vBasis, vExtra );
    Vec_IntShrink( vBasis, nSizeOld );
    Vec_IntAppend( vBasis, vExtra );
    // find the smallest with the second half added
    Fra_ClauMinimizeClause_rec( p, vBasis, vExtra2 );
    Vec_IntShrink( vBasis, nSizeOld );
    Vec_IntAppend( vExtra, vExtra2 );
    Vec_IntFree( vExtra2 );
}